

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O1

void duckdb::IntegralCompressFunction<unsigned_long,unsigned_long>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  char cVar3;
  long lVar4;
  ulong count;
  long *plVar5;
  long *plVar6;
  unsigned_long *puVar7;
  data_ptr_t pdVar8;
  data_ptr_t pdVar9;
  allocate_function_ptr_t p_Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar11;
  bool bVar12;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  SelectionVector *pSVar15;
  reference pvVar16;
  VectorBuffer *pVVar17;
  idx_t iVar18;
  idx_t iVar19;
  TemplatedValidityData<unsigned_long> *pTVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  unsigned_long uVar25;
  idx_t idx_in_entry;
  ulong uVar26;
  optional_idx dict_size;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  Vector *local_90;
  buffer_ptr<VectorBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pvVar16 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  lVar4 = *(long *)pvVar16->data;
  pvVar16 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar2 = pvVar16->vector_type;
  if (VVar2 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar9 = result->data;
    pdVar8 = pvVar16->data;
    FlatVector::VerifyFlatVector(pvVar16);
    FlatVector::VerifyFlatVector(result);
    puVar7 = (pvVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar7 == (unsigned_long *)0x0) {
      if (count == 0) {
        return;
      }
      uVar26 = 0;
      do {
        *(long *)(pdVar9 + uVar26 * 8) = *(long *)(pdVar8 + uVar26 * 8) - lVar4;
        uVar26 = uVar26 + 1;
      } while (count != uVar26);
      return;
    }
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar7;
    shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
               &(pvVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
    (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
         (pvVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
    if (count + 0x3f < 0x40) {
      return;
    }
    puVar7 = (pvVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    uVar23 = 0;
    uVar26 = 0;
    do {
      if (puVar7 == (unsigned_long *)0x0) {
        uVar25 = 0xffffffffffffffff;
      }
      else {
        uVar25 = puVar7[uVar23];
      }
      uVar24 = uVar26 + 0x40;
      if (count <= uVar26 + 0x40) {
        uVar24 = count;
      }
      uVar22 = uVar24;
      if (uVar25 != 0) {
        uVar22 = uVar26;
        if (uVar25 == 0xffffffffffffffff) {
          if (uVar26 < uVar24) {
            do {
              *(long *)(pdVar9 + uVar22 * 8) = *(long *)(pdVar8 + uVar22 * 8) - lVar4;
              uVar22 = uVar22 + 1;
            } while (uVar24 != uVar22);
          }
        }
        else if (uVar26 < uVar24) {
          uVar22 = 0;
          do {
            if ((uVar25 >> (uVar22 & 0x3f) & 1) != 0) {
              *(long *)(pdVar9 + uVar22 * 8 + uVar26 * 8) =
                   *(long *)(pdVar8 + uVar22 * 8 + uVar26 * 8) - lVar4;
            }
            uVar22 = uVar22 + 1;
          } while ((uVar26 - uVar24) + uVar22 != 0);
          uVar22 = uVar26 + uVar22;
        }
      }
      uVar23 = uVar23 + 1;
      uVar26 = uVar22;
    } while (uVar23 != count + 0x3f >> 6);
    return;
  }
  if (VVar2 != DICTIONARY_VECTOR) {
    if (VVar2 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      plVar5 = (long *)result->data;
      plVar6 = (long *)pvVar16->data;
      puVar7 = (pvVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar7 != (unsigned_long *)0x0) && ((*puVar7 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      *plVar5 = *plVar6 - lVar4;
      return;
    }
    goto LAB_013f4a1f;
  }
  DictionaryVector::VerifyDictionary(pvVar16);
  pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar16->buffer);
  local_78.sel = (SelectionVector *)pVVar17[1].data.allocator.ptr;
  if (((Allocator *)local_78.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar18 = optional_idx::GetIndex((optional_idx *)&local_78), count < iVar18 * 2)) {
LAB_013f4a15:
    bVar12 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(pvVar16);
    pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar16->auxiliary);
    cVar3 = *(char *)&pVVar17[1]._vptr_VectorBuffer;
    bVar12 = false;
    if (cVar3 == '\0') {
      local_90 = (Vector *)(pVVar17 + 1);
      pdVar9 = result->data;
      pdVar8 = pVVar17[1].data.pointer;
      local_88 = &pvVar16->buffer;
      iVar18 = optional_idx::GetIndex((optional_idx *)&local_78);
      FlatVector::VerifyFlatVector(local_90);
      FlatVector::VerifyFlatVector(result);
      puVar7 = (unsigned_long *)pVVar17[1].data.allocated_size;
      if (puVar7 == (unsigned_long *)0x0) {
        if (iVar18 != 0) {
          iVar19 = 0;
          do {
            *(long *)(pdVar9 + iVar19 * 8) = *(long *)(pdVar8 + iVar19 * 8) - lVar4;
            iVar19 = iVar19 + 1;
          } while (iVar18 != iVar19);
        }
      }
      else {
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar7;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(pVVar17 + 2));
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (idx_t)pVVar17[2].aux_data.
                    super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                    .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
        if (0x3f < iVar18 + 0x3f) {
          iVar19 = pVVar17[1].data.allocated_size;
          uVar23 = 0;
          uVar26 = 0;
          do {
            if (iVar19 == 0) {
              uVar24 = 0xffffffffffffffff;
            }
            else {
              uVar24 = *(ulong *)(iVar19 + uVar23 * 8);
            }
            uVar22 = uVar26 + 0x40;
            if (iVar18 <= uVar26 + 0x40) {
              uVar22 = iVar18;
            }
            uVar21 = uVar22;
            if (uVar24 != 0) {
              uVar21 = uVar26;
              if (uVar24 == 0xffffffffffffffff) {
                if (uVar26 < uVar22) {
                  do {
                    *(long *)(pdVar9 + uVar21 * 8) = *(long *)(pdVar8 + uVar21 * 8) - lVar4;
                    uVar21 = uVar21 + 1;
                  } while (uVar22 != uVar21);
                }
              }
              else if (uVar26 < uVar22) {
                uVar21 = 0;
                do {
                  if ((uVar24 >> (uVar21 & 0x3f) & 1) != 0) {
                    *(long *)(pdVar9 + uVar21 * 8 + uVar26 * 8) =
                         *(long *)(pdVar8 + uVar21 * 8 + uVar26 * 8) - lVar4;
                  }
                  uVar21 = uVar21 + 1;
                } while ((uVar26 - uVar22) + uVar21 != 0);
                uVar21 = uVar26 + uVar21;
              }
            }
            uVar23 = uVar23 + 1;
            uVar26 = uVar21;
          } while (uVar23 != iVar18 + 0x3f >> 6);
        }
      }
      DictionaryVector::VerifyDictionary(pvVar16);
      pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(local_88);
      iVar18 = optional_idx::GetIndex((optional_idx *)&local_78);
      Vector::Dictionary(result,result,iVar18,(SelectionVector *)(pVVar17 + 1),count);
      bVar12 = true;
    }
    if (cVar3 != '\0') goto LAB_013f4a15;
  }
  if (bVar12) {
    return;
  }
LAB_013f4a1f:
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(pvVar16,count,&local_78);
  Vector::SetVectorType(result,FLAT_VECTOR);
  pSVar15 = local_78.sel;
  pdVar9 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      p_Var10 = (allocate_function_ptr_t)pSVar15->sel_vector;
      uVar26 = 0;
      do {
        uVar23 = uVar26;
        if (p_Var10 != (allocate_function_ptr_t)0x0) {
          uVar23 = (ulong)*(uint *)(p_Var10 + uVar26 * 4);
        }
        *(long *)(pdVar9 + uVar26 * 8) = *(long *)(local_78.data + uVar23 * 8) - lVar4;
        uVar26 = uVar26 + 1;
      } while (count != uVar26);
    }
  }
  else if (count != 0) {
    p_Var10 = (allocate_function_ptr_t)pSVar15->sel_vector;
    uVar26 = 0;
    do {
      uVar23 = uVar26;
      if (p_Var10 != (allocate_function_ptr_t)0x0) {
        uVar23 = (ulong)*(uint *)(p_Var10 + uVar26 * 4);
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
           >> (uVar23 & 0x3f) & 1) == 0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_a8,&local_80);
          p_Var14 = p_Stack_a0;
          peVar13 = local_a8;
          local_a8 = (element_type *)0x0;
          p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar13;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var14;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
          }
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar11 = (byte)uVar26 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar26 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
      }
      else {
        *(long *)(pdVar9 + uVar26 * 8) = *(long *)(local_78.data + uVar23 * 8) - lVar4;
      }
      uVar26 = uVar26 + 1;
    } while (count != uVar26);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}